

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_file.hpp
# Opt level: O0

Lazy<std::pair<std::error_code,_unsigned_long>_> __thiscall
coro_io::basic_random_coro_file<(coro_io::execution_type)2>::
async_prw<long(*)(int,void*,unsigned_long,long)>
          (basic_random_coro_file<(coro_io::execution_type)2> *this,
          _func_long_int_void_ptr_unsigned_long_long *io_func,bool is_read,size_t offset,char *buf,
          size_t size)

{
  int iVar1;
  bool bVar2;
  undefined8 *puVar3;
  undefined8 *extraout_RAX;
  int *piVar4;
  undefined8 *extraout_RAX_00;
  byte in_CL;
  long *plVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<std::pair<std::error_code,_unsigned_long>,_false> in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  error_code eVar6;
  undefined8 in_stack_00000008;
  int len;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  function<int_()> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd54;
  LazyAwaiterBase<async_simple::Try<int>_> *in_stack_fffffffffffffd58;
  int local_2a0;
  undefined4 uStack_16c;
  ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>
  *in_stack_fffffffffffffee0;
  function<int_()> *in_stack_fffffffffffffee8;
  
  puVar3 = (undefined8 *)operator_new(0x108,(nothrow_t *)&std::nothrow);
  if (puVar3 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar3 = async_prw<long(*)(int,void*,unsigned_long,long)>;
    puVar3[1] = async_prw<long(*)(int,void*,unsigned_long,long)>;
    plVar5 = puVar3 + 0x1c;
    puVar3[0x1f] = in_RSI;
    puVar3[0x17] = in_RDX;
    *(byte *)((long)puVar3 + 0x105) = in_CL & 1;
    puVar3[0x18] = in_R8;
    puVar3[0x19] = in_R9;
    puVar3[0x1a] = in_stack_00000008;
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::LazyPromise
              ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
    async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
    get_return_object((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                      CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar3 + 2));
    bVar2 = std::suspend_always::await_ready((suspend_always *)((long)puVar3 + 0x106));
    if (bVar2) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar3 + 0x106));
      std::function<int()>::
      function<coro_io::basic_random_coro_file<(coro_io::execution_type)2>::async_prw<long(*)(int,void*,unsigned_long,long)>(long(*)(int,void*,unsigned_long,long),bool,unsigned_long,char*,unsigned_long)::_lambda()_1_,void>
                (in_stack_fffffffffffffd40,
                 (anon_class_40_5_4bdf3a24 *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::error_code::error_code
                ((error_code *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      *plVar5 = 0;
      std::function<int_()>::function
                ((function<int_()> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                 (function<int_()> *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
      post<std::function<int()>>(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<async_simple::Try<int>>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 (Lazy<async_simple::Try<int>_> *)
                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      bVar2 = async_simple::coro::detail::LazyAwaiterBase<async_simple::Try<int>_>::await_ready
                        ((LazyAwaiterBase<async_simple::Try<int>_> *)(puVar3 + 0x1d));
      if (bVar2) {
        puVar3[0x15] = puVar3 + 0x13;
        puVar3[0x16] = (LazyAwaiterBase<async_simple::Try<int>_> *)(puVar3 + 0x1d);
        async_simple::coro::detail::LazyAwaiterBase<async_simple::Try<int>_>::awaitResume
                  (in_stack_fffffffffffffd58);
        async_simple::coro::detail::LazyBase<async_simple::Try<int>,_false>::ValueAwaiter::
        ~ValueAwaiter((ValueAwaiter *)0x19c05a);
        async_simple::coro::Lazy<async_simple::Try<int>_>::~Lazy
                  ((Lazy<async_simple::Try<int>_> *)0x19c067);
        std::function<int_()>::~function((function<int_()> *)0x19c074);
        piVar4 = async_simple::Try<int>::value((Try<int> *)in_stack_fffffffffffffd40);
        iVar1 = *piVar4;
        if (iVar1 == 0) {
          if ((*(byte *)((long)puVar3 + 0x105) & 1) != 0) {
            *(undefined1 *)(puVar3[0x1f] + 0x60) = 1;
          }
        }
        else if (iVar1 < 1) {
          eVar6 = std::make_error_code(0);
          puVar3[0x11] = CONCAT44(uStack_16c,eVar6._M_value);
          puVar3[0x12] = eVar6._M_cat;
          *plVar5 = (long)iVar1;
        }
        else {
          *plVar5 = (long)iVar1;
        }
        std::make_pair<std::error_code&,unsigned_long&>
                  ((error_code *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (unsigned_long *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        return_value<std::pair<std::error_code,_unsigned_long>_>
                  ((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)
                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   (pair<std::error_code,_unsigned_long> *)
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
        async_simple::Try<int>::~Try((Try<int> *)0x19c1cc);
        local_2a0 = 3;
        std::function<int_()>::~function((function<int_()> *)0x19c21e);
        if (local_2a0 == 3) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar3 + 2));
          bVar2 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar3 + 0x107));
          if (!bVar2) {
            *puVar3 = 0;
            *(undefined1 *)((long)puVar3 + 0x104) = 2;
            coro_io::basic_random_coro_file
                      (in_stack_fffffffffffffd40,
                       (void *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<std::pair<std::error_code,_unsigned_long>_>)
                   in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar3 + 0x107));
        }
        async_simple::coro::detail::LazyPromise<std::pair<std::error_code,_unsigned_long>_>::
        ~LazyPromise((LazyPromise<std::pair<std::error_code,_unsigned_long>_> *)0x19c390);
        if (puVar3 != (undefined8 *)0x0) {
          operator_delete(puVar3,0x108);
        }
      }
      else {
        *(undefined1 *)((long)puVar3 + 0x104) = 1;
        coro_io::basic_random_coro_file
                  ((void *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   (void *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar3 + 0x104) = 0;
      coro_io::basic_random_coro_file
                (in_stack_fffffffffffffd40,
                 (void *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
  }
  return (Lazy<std::pair<std::error_code,_unsigned_long>_>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<std::pair<std::error_code, size_t>> async_prw(
      auto io_func, bool is_read, size_t offset, char *buf, size_t size) {
    std::function<int()> func = [=, this] {
      int fd = *prw_random_file_;
      return io_func(fd, buf, size, offset);
    };

    std::error_code ec{};
    size_t op_size = 0;

    auto len_val = co_await coro_io::post(std::move(func), &executor_wrapper_);
    int len = len_val.value();
    if (len == 0) {
      if (is_read) {
        eof_ = true;
      }
    }
    else if (len > 0) {
      op_size = len;
    }
    else {
      ec = std::make_error_code(std::errc::io_error);
      op_size = len;
    }

    co_return std::make_pair(ec, op_size);
  }